

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

void VP8PutSignedBits(VP8BitWriter *bw,int value,int nb_bits)

{
  uint32_t value_00;
  
  VP8PutBitUniform(bw,(uint)(value != 0));
  if (value != 0) {
    value_00 = value * -2 + 1;
    if (-1 < value) {
      value_00 = value * 2;
    }
    VP8PutBits(bw,value_00,nb_bits + 1);
    return;
  }
  return;
}

Assistant:

void VP8PutSignedBits(VP8BitWriter* const bw, int value, int nb_bits) {
  if (!VP8PutBitUniform(bw, value != 0)) return;
  if (value < 0) {
    VP8PutBits(bw, ((-value) << 1) | 1, nb_bits + 1);
  } else {
    VP8PutBits(bw, value << 1, nb_bits + 1);
  }
}